

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jidctint.c
# Opt level: O3

void jpeg_idct_11x11(j_decompress_ptr cinfo,jpeg_component_info *compptr,JCOEFPTR coef_block,
                    JSAMPARRAY output_buf,JDIMENSION output_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  JSAMPLE *pJVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  int iVar36;
  long lVar37;
  long lVar38;
  int iVar39;
  int iVar40;
  long lVar41;
  long lVar42;
  int aiStack_198 [90];
  
  pJVar7 = cinfo->sample_range_limit;
  pvVar8 = compptr->dct_table;
  lVar24 = 0;
  do {
    lVar13 = (long)*(short *)((long)pvVar8 + lVar24 * 2) * (long)coef_block[lVar24] * 0x2000;
    lVar10 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x20) * (long)coef_block[lVar24 + 0x10];
    lVar29 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x40) * (long)coef_block[lVar24 + 0x20];
    lVar21 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x60) * (long)coef_block[lVar24 + 0x30];
    lVar25 = (lVar21 + lVar10) - lVar29;
    lVar30 = (lVar29 - lVar21) * 0x517e;
    lVar41 = lVar25 * 0x2b6c + lVar13 + 0x400;
    lVar34 = (lVar29 - lVar10) * 0xdc9 + lVar41;
    lVar33 = lVar29 * -0x3a4c + lVar30 + lVar34;
    lVar37 = lVar21 * 0x43b5 + lVar30 + lVar41;
    lVar34 = lVar10 * -0x306f + lVar34;
    lVar41 = (lVar21 + lVar10) * -0x24fb + lVar41;
    lVar42 = lVar21 * -0x193d + lVar41;
    lVar41 = lVar10 * -0x2c83 + lVar29 * 0x3e39 + lVar41;
    lVar38 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x10) * (long)coef_block[lVar24 + 8];
    lVar21 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x30) * (long)coef_block[lVar24 + 0x18];
    lVar18 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x50) * (long)coef_block[lVar24 + 0x28];
    lVar31 = (long)*(short *)((long)pvVar8 + lVar24 * 2 + 0x70) * (long)coef_block[lVar24 + 0x38];
    lVar29 = (lVar31 + lVar18 + lVar21 + lVar38) * 0xcc0;
    lVar22 = (lVar21 + lVar38) * 0x1c6a;
    lVar30 = (lVar18 + lVar38) * 0x1574;
    lVar23 = (lVar21 + lVar18) * -0x2537 + lVar29;
    lVar10 = lVar18 * -0x2626 + lVar30 + lVar23;
    lVar26 = (lVar31 + lVar21) * -0x398b;
    lVar23 = lVar21 * 0x4258 + lVar22 + lVar26 + lVar23;
    lVar27 = (lVar31 + lVar38) * 3000 + lVar29;
    lVar30 = lVar38 * -0x1d8a + lVar22 + lVar30 + lVar27;
    lVar27 = lVar31 * 0x4347 + lVar26 + lVar27;
    lVar29 = lVar31 * -0x35ea + lVar18 * 0x200b + lVar21 * -0x2ef3 + lVar29;
    aiStack_198[lVar24] = (int)((ulong)(lVar30 + lVar37) >> 0xb);
    aiStack_198[lVar24 + 0x50] = (int)((ulong)(lVar37 - lVar30) >> 0xb);
    aiStack_198[lVar24 + 8] = (int)((ulong)(lVar23 + lVar33) >> 0xb);
    aiStack_198[lVar24 + 0x48] = (int)((ulong)(lVar33 - lVar23) >> 0xb);
    aiStack_198[lVar24 + 0x10] = (int)((ulong)(lVar10 + lVar42) >> 0xb);
    aiStack_198[lVar24 + 0x40] = (int)((ulong)(lVar42 - lVar10) >> 0xb);
    aiStack_198[lVar24 + 0x18] = (int)((ulong)(lVar27 + lVar34) >> 0xb);
    aiStack_198[lVar24 + 0x38] = (int)((ulong)(lVar34 - lVar27) >> 0xb);
    aiStack_198[lVar24 + 0x20] = (int)((ulong)(lVar29 + lVar41) >> 0xb);
    aiStack_198[lVar24 + 0x30] = (int)((ulong)(lVar41 - lVar29) >> 0xb);
    aiStack_198[lVar24 + 0x28] = (int)(lVar25 * 0x7ffffffd2bf + lVar13 + 0x400U >> 0xb);
    lVar24 = lVar24 + 1;
  } while ((int)lVar24 != 8);
  uVar11 = (ulong)output_col;
  lVar24 = 0;
  do {
    iVar1 = aiStack_198[lVar24];
    iVar15 = aiStack_198[lVar24 + 1];
    iVar2 = aiStack_198[lVar24 + 2];
    iVar3 = aiStack_198[lVar24 + 4];
    iVar39 = aiStack_198[lVar24 + 6];
    iVar12 = (iVar39 + iVar2) - iVar3;
    iVar14 = (iVar3 - iVar39) * 0x517e;
    iVar35 = iVar12 * 0x2b6c + iVar1 * 0x2000 + 0x20000;
    iVar32 = (iVar3 - iVar2) * 0xdc9 + iVar35;
    iVar4 = aiStack_198[lVar24 + 3];
    iVar5 = aiStack_198[lVar24 + 5];
    iVar40 = (iVar39 + iVar2) * -0x24fb + iVar35;
    iVar6 = aiStack_198[lVar24 + 7];
    iVar35 = iVar39 * 0x43b5 + iVar14 + iVar35;
    iVar16 = (iVar4 + iVar15) * 0x1c6a;
    iVar19 = (iVar5 + iVar15) * 0x1574;
    iVar28 = iVar3 * -0x3a4c + iVar14 + iVar32;
    iVar32 = iVar2 * -0x306f + iVar32;
    iVar17 = (iVar5 + iVar6 + iVar4 + iVar15) * 0xcc0;
    iVar20 = (iVar5 + iVar4) * -0x2537 + iVar17;
    iVar36 = iVar5 * -0x2626 + iVar19 + iVar20;
    iVar14 = (iVar6 + iVar4) * -0x398b;
    iVar20 = iVar4 * 0x4258 + iVar16 + iVar14 + iVar20;
    iVar9 = (iVar6 + iVar15) * 3000 + iVar17;
    iVar15 = iVar15 * -0x1d8a + iVar16 + iVar19 + iVar9;
    iVar9 = iVar6 * 0x4347 + iVar14 + iVar9;
    iVar39 = iVar39 * -0x193d + iVar40;
    iVar40 = iVar2 * -0x2c83 + iVar3 * 0x3e39 + iVar40;
    iVar17 = iVar6 * -0x35ea + iVar5 * 0x200b + iVar4 * -0x2ef3 + iVar17;
    lVar10 = *(long *)((long)output_buf + lVar24);
    *(JSAMPLE *)(lVar10 + uVar11) = pJVar7[(ulong)((uint)(iVar15 + iVar35) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 10 + uVar11) =
         pJVar7[(ulong)((uint)(iVar35 - iVar15) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 1 + uVar11) =
         pJVar7[(ulong)((uint)(iVar20 + iVar28) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 9 + uVar11) =
         pJVar7[(ulong)((uint)(iVar28 - iVar20) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 2 + uVar11) =
         pJVar7[(ulong)((uint)(iVar36 + iVar39) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 8 + uVar11) =
         pJVar7[(ulong)((uint)(iVar39 - iVar36) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 3 + uVar11) =
         pJVar7[(ulong)((uint)(iVar32 + iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 7 + uVar11) =
         pJVar7[(ulong)((uint)(iVar32 - iVar9) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 4 + uVar11) =
         pJVar7[(ulong)((uint)(iVar17 + iVar40) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 6 + uVar11) =
         pJVar7[(ulong)((uint)(iVar40 - iVar17) >> 0x12 & 0x3ff) + 0x80];
    *(JSAMPLE *)(lVar10 + 5 + uVar11) =
         pJVar7[(ulong)(iVar1 * 0x2000 + iVar12 * 0xfffd2bf + 0x20000U >> 0x12 & 0x3ff) + 0x80];
    lVar24 = lVar24 + 8;
  } while (lVar24 != 0x58);
  return;
}

Assistant:

GLOBAL(void)
jpeg_idct_11x11(j_decompress_ptr cinfo, jpeg_component_info *compptr,
                JCOEFPTR coef_block, JSAMPARRAY output_buf,
                JDIMENSION output_col)
{
  JLONG tmp10, tmp11, tmp12, tmp13, tmp14;
  JLONG tmp20, tmp21, tmp22, tmp23, tmp24, tmp25;
  JLONG z1, z2, z3, z4;
  JCOEFPTR inptr;
  ISLOW_MULT_TYPE *quantptr;
  int *wsptr;
  JSAMPROW outptr;
  JSAMPLE *range_limit = IDCT_range_limit(cinfo);
  int ctr;
  int workspace[8 * 11];        /* buffers data between passes */
  SHIFT_TEMPS

  /* Pass 1: process columns from input, store into work array. */

  inptr = coef_block;
  quantptr = (ISLOW_MULT_TYPE *)compptr->dct_table;
  wsptr = workspace;
  for (ctr = 0; ctr < 8; ctr++, inptr++, quantptr++, wsptr++) {
    /* Even part */

    tmp10 = DEQUANTIZE(inptr[DCTSIZE * 0], quantptr[DCTSIZE * 0]);
    tmp10 = LEFT_SHIFT(tmp10, CONST_BITS);
    /* Add fudge factor here for final descale. */
    tmp10 += ONE << (CONST_BITS - PASS1_BITS - 1);

    z1 = DEQUANTIZE(inptr[DCTSIZE * 2], quantptr[DCTSIZE * 2]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 4], quantptr[DCTSIZE * 4]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 6], quantptr[DCTSIZE * 6]);

    tmp20 = MULTIPLY(z2 - z3, FIX(2.546640132));     /* c2+c4 */
    tmp23 = MULTIPLY(z2 - z1, FIX(0.430815045));     /* c2-c6 */
    z4 = z1 + z3;
    tmp24 = MULTIPLY(z4, -FIX(1.155664402));         /* -(c2-c10) */
    z4 -= z2;
    tmp25 = tmp10 + MULTIPLY(z4, FIX(1.356927976));  /* c2 */
    tmp21 = tmp20 + tmp23 + tmp25 -
            MULTIPLY(z2, FIX(1.821790775));          /* c2+c4+c10-c6 */
    tmp20 += tmp25 + MULTIPLY(z3, FIX(2.115825087)); /* c4+c6 */
    tmp23 += tmp25 - MULTIPLY(z1, FIX(1.513598477)); /* c6+c8 */
    tmp24 += tmp25;
    tmp22 = tmp24 - MULTIPLY(z3, FIX(0.788749120));  /* c8+c10 */
    tmp24 += MULTIPLY(z2, FIX(1.944413522)) -        /* c2+c8 */
             MULTIPLY(z1, FIX(1.390975730));         /* c4+c10 */
    tmp25 = tmp10 - MULTIPLY(z4, FIX(1.414213562));  /* c0 */

    /* Odd part */

    z1 = DEQUANTIZE(inptr[DCTSIZE * 1], quantptr[DCTSIZE * 1]);
    z2 = DEQUANTIZE(inptr[DCTSIZE * 3], quantptr[DCTSIZE * 3]);
    z3 = DEQUANTIZE(inptr[DCTSIZE * 5], quantptr[DCTSIZE * 5]);
    z4 = DEQUANTIZE(inptr[DCTSIZE * 7], quantptr[DCTSIZE * 7]);

    tmp11 = z1 + z2;
    tmp14 = MULTIPLY(tmp11 + z3 + z4, FIX(0.398430003)); /* c9 */
    tmp11 = MULTIPLY(tmp11, FIX(0.887983902));           /* c3-c9 */
    tmp12 = MULTIPLY(z1 + z3, FIX(0.670361295));         /* c5-c9 */
    tmp13 = tmp14 + MULTIPLY(z1 + z4, FIX(0.366151574)); /* c7-c9 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(0.923107866));              /* c7+c5+c3-c1-2*c9 */
    z1    = tmp14 - MULTIPLY(z2 + z3, FIX(1.163011579)); /* c7+c9 */
    tmp11 += z1 + MULTIPLY(z2, FIX(2.073276588));        /* c1+c7+3*c9-c3 */
    tmp12 += z1 - MULTIPLY(z3, FIX(1.192193623));        /* c3+c5-c7-c9 */
    z1    = MULTIPLY(z2 + z4, -FIX(1.798248910));        /* -(c1+c9) */
    tmp11 += z1;
    tmp13 += z1 + MULTIPLY(z4, FIX(2.102458632));        /* c1+c5+c9-c7 */
    tmp14 += MULTIPLY(z2, -FIX(1.467221301)) +           /* -(c5+c9) */
             MULTIPLY(z3, FIX(1.001388905)) -            /* c1-c9 */
             MULTIPLY(z4, FIX(1.684843907));             /* c3+c9 */

    /* Final output stage */

    wsptr[8 * 0]  = (int)RIGHT_SHIFT(tmp20 + tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 10] = (int)RIGHT_SHIFT(tmp20 - tmp10, CONST_BITS - PASS1_BITS);
    wsptr[8 * 1]  = (int)RIGHT_SHIFT(tmp21 + tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 9]  = (int)RIGHT_SHIFT(tmp21 - tmp11, CONST_BITS - PASS1_BITS);
    wsptr[8 * 2]  = (int)RIGHT_SHIFT(tmp22 + tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 8]  = (int)RIGHT_SHIFT(tmp22 - tmp12, CONST_BITS - PASS1_BITS);
    wsptr[8 * 3]  = (int)RIGHT_SHIFT(tmp23 + tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 7]  = (int)RIGHT_SHIFT(tmp23 - tmp13, CONST_BITS - PASS1_BITS);
    wsptr[8 * 4]  = (int)RIGHT_SHIFT(tmp24 + tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 6]  = (int)RIGHT_SHIFT(tmp24 - tmp14, CONST_BITS - PASS1_BITS);
    wsptr[8 * 5]  = (int)RIGHT_SHIFT(tmp25, CONST_BITS - PASS1_BITS);
  }

  /* Pass 2: process 11 rows from work array, store into output array. */

  wsptr = workspace;
  for (ctr = 0; ctr < 11; ctr++) {
    outptr = output_buf[ctr] + output_col;

    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp10 = (JLONG)wsptr[0] + (ONE << (PASS1_BITS + 2));
    tmp10 = LEFT_SHIFT(tmp10, CONST_BITS);

    z1 = (JLONG)wsptr[2];
    z2 = (JLONG)wsptr[4];
    z3 = (JLONG)wsptr[6];

    tmp20 = MULTIPLY(z2 - z3, FIX(2.546640132));     /* c2+c4 */
    tmp23 = MULTIPLY(z2 - z1, FIX(0.430815045));     /* c2-c6 */
    z4 = z1 + z3;
    tmp24 = MULTIPLY(z4, -FIX(1.155664402));         /* -(c2-c10) */
    z4 -= z2;
    tmp25 = tmp10 + MULTIPLY(z4, FIX(1.356927976));  /* c2 */
    tmp21 = tmp20 + tmp23 + tmp25 -
            MULTIPLY(z2, FIX(1.821790775));          /* c2+c4+c10-c6 */
    tmp20 += tmp25 + MULTIPLY(z3, FIX(2.115825087)); /* c4+c6 */
    tmp23 += tmp25 - MULTIPLY(z1, FIX(1.513598477)); /* c6+c8 */
    tmp24 += tmp25;
    tmp22 = tmp24 - MULTIPLY(z3, FIX(0.788749120));  /* c8+c10 */
    tmp24 += MULTIPLY(z2, FIX(1.944413522)) -        /* c2+c8 */
             MULTIPLY(z1, FIX(1.390975730));         /* c4+c10 */
    tmp25 = tmp10 - MULTIPLY(z4, FIX(1.414213562));  /* c0 */

    /* Odd part */

    z1 = (JLONG)wsptr[1];
    z2 = (JLONG)wsptr[3];
    z3 = (JLONG)wsptr[5];
    z4 = (JLONG)wsptr[7];

    tmp11 = z1 + z2;
    tmp14 = MULTIPLY(tmp11 + z3 + z4, FIX(0.398430003)); /* c9 */
    tmp11 = MULTIPLY(tmp11, FIX(0.887983902));           /* c3-c9 */
    tmp12 = MULTIPLY(z1 + z3, FIX(0.670361295));         /* c5-c9 */
    tmp13 = tmp14 + MULTIPLY(z1 + z4, FIX(0.366151574)); /* c7-c9 */
    tmp10 = tmp11 + tmp12 + tmp13 -
            MULTIPLY(z1, FIX(0.923107866));              /* c7+c5+c3-c1-2*c9 */
    z1    = tmp14 - MULTIPLY(z2 + z3, FIX(1.163011579)); /* c7+c9 */
    tmp11 += z1 + MULTIPLY(z2, FIX(2.073276588));        /* c1+c7+3*c9-c3 */
    tmp12 += z1 - MULTIPLY(z3, FIX(1.192193623));        /* c3+c5-c7-c9 */
    z1    = MULTIPLY(z2 + z4, -FIX(1.798248910));        /* -(c1+c9) */
    tmp11 += z1;
    tmp13 += z1 + MULTIPLY(z4, FIX(2.102458632));        /* c1+c5+c9-c7 */
    tmp14 += MULTIPLY(z2, -FIX(1.467221301)) +           /* -(c5+c9) */
             MULTIPLY(z3, FIX(1.001388905)) -            /* c1-c9 */
             MULTIPLY(z4, FIX(1.684843907));             /* c3+c9 */

    /* Final output stage */

    outptr[0]  = range_limit[(int)RIGHT_SHIFT(tmp20 + tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[10] = range_limit[(int)RIGHT_SHIFT(tmp20 - tmp10,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[1]  = range_limit[(int)RIGHT_SHIFT(tmp21 + tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[9]  = range_limit[(int)RIGHT_SHIFT(tmp21 - tmp11,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[2]  = range_limit[(int)RIGHT_SHIFT(tmp22 + tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[8]  = range_limit[(int)RIGHT_SHIFT(tmp22 - tmp12,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[3]  = range_limit[(int)RIGHT_SHIFT(tmp23 + tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[7]  = range_limit[(int)RIGHT_SHIFT(tmp23 - tmp13,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[4]  = range_limit[(int)RIGHT_SHIFT(tmp24 + tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[6]  = range_limit[(int)RIGHT_SHIFT(tmp24 - tmp14,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];
    outptr[5]  = range_limit[(int)RIGHT_SHIFT(tmp25,
                                              CONST_BITS + PASS1_BITS + 3) &
                             RANGE_MASK];

    wsptr += 8;         /* advance pointer to next row */
  }
}